

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::on_storage_moved
          (torrent *this,status_t status,string *path,storage_error *error)

{
  _func_int *p_Var1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined1 local_50 [40];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  this->field_0x600 = this->field_0x600 & 0xdf;
  p_Var1 = (((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[5]
  ;
  if ((status.m_val & 5) == 0) {
    iVar2 = (*p_Var1)();
    if ((*(uint *)(CONCAT44(extraout_var_01,iVar2) + 0x68) & 8) != 0) {
      iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)local_50);
      alert_manager::
      emplace_alert<libtorrent::storage_moved_alert,libtorrent::torrent_handle,std::__cxx11::string_const&,std::__cxx11::string&>
                ((alert_manager *)CONCAT44(extraout_var_02,iVar2),(torrent_handle *)local_50,path,
                 &this->m_save_path);
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
    }
    ::std::__cxx11::string::_M_assign((string *)&this->m_save_path);
    set_need_save_resume(this,(resume_data_flags_t)0x20);
    if ((status.m_val & 2) != 0) {
      force_recheck(this);
    }
  }
  else {
    iVar2 = (*p_Var1)();
    if ((*(uint *)(CONCAT44(extraout_var,iVar2) + 0x68) & 8) != 0) {
      iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)(local_50 + 0x20));
      resolve_filename_abi_cxx11_
                ((string *)local_50,this,(file_index_t)(int)*(int3 *)&error->field_0x10);
      alert_manager::
      emplace_alert<libtorrent::storage_moved_failed_alert,libtorrent::torrent_handle,boost::system::error_code_const&,std::__cxx11::string,libtorrent::operation_t_const&>
                ((alert_manager *)CONCAT44(extraout_var_00,iVar2),
                 (torrent_handle *)(local_50 + 0x20),&error->ec,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 &error->operation);
      ::std::__cxx11::string::~string((string *)local_50);
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_28);
    }
  }
  return;
}

Assistant:

void torrent::on_storage_moved(status_t const status, std::string const& path
		, storage_error const& error) try
	{
		TORRENT_ASSERT(is_single_thread());

		m_moving_storage = false;
		bool const has_error_status
			= (status & disk_status::fatal_disk_error)
			|| (status & disk_status::file_exist);

		if (!has_error_status)
		{
			if (alerts().should_post<storage_moved_alert>())
				alerts().emplace_alert<storage_moved_alert>(get_handle(), path, m_save_path);
			m_save_path = path;
			set_need_save_resume(torrent_handle::if_config_changed);
			if (status & disk_status::need_full_check)
				force_recheck();
		}
		else
		{
			if (alerts().should_post<storage_moved_failed_alert>())
				alerts().emplace_alert<storage_moved_failed_alert>(get_handle(), error.ec
					, resolve_filename(error.file()), error.operation);
		}
	}
	catch (...) { handle_exception(); }